

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::upToFirst(String *this,String *find,bool includeFind)

{
  int iVar1;
  char in_CL;
  undefined7 in_register_00000011;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  String SVar3;
  uchar *puVar2;
  
  iVar1 = binstr(&find->super_tagbstring,0,(bstring)CONCAT71(in_register_00000011,includeFind));
  if (iVar1 == -1) {
    if (in_CL == '\0') {
      String(this,find);
      puVar2 = extraout_RDX_00;
    }
    else {
      String(this,"");
      puVar2 = extraout_RDX;
    }
  }
  else {
    SVar3 = midString(this,(int)find,0);
    puVar2 = SVar3.super_tagbstring.data;
  }
  SVar3.super_tagbstring.data = puVar2;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

const String String::upToFirst(const String & find, const bool includeFind) const
    {
        int pos = Find(find, 0);
        if (pos == -1) return includeFind ? "" : *this;
        return midString(0, includeFind ? pos + find.getLength() : pos);
    }